

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_reporter.h
# Opt level: O2

string * __thiscall
bandit::detail::progress_reporter::current_context_name_abi_cxx11_
          (string *__return_storage_ptr__,progress_reporter *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::
  for_each<std::_List_iterator<std::__cxx11::string>,bandit::detail::progress_reporter::current_context_name()::_lambda(std::__cxx11::string)_1_>
            ((this->contexts_).
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&this->contexts_,(anon_class_8_1_898f2789)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string current_context_name()
    {
      std::string name;

      std::for_each(contexts_.begin(), contexts_.end(), [&](const std::string context){
          if(name.size() > 0)
          {
          name += " ";
          }

          name += context;
          });

      return name;
    }